

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O2

QModelIndex * __thiscall
QUndoModel::selectedIndex(QModelIndex *__return_storage_ptr__,QUndoModel *this)

{
  int iVar1;
  int iVar2;
  
  if (this->m_stack == (QUndoStack *)0x0) {
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
    iVar1 = -1;
    iVar2 = iVar1;
  }
  else {
    iVar1 = QUndoStack::index();
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = &this->super_QAbstractItemModel;
    iVar2 = 0;
  }
  __return_storage_ptr__->r = iVar1;
  __return_storage_ptr__->c = iVar2;
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QUndoModel::selectedIndex() const
{
    return m_stack == nullptr ? QModelIndex() : createIndex(m_stack->index(), 0);
}